

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O2

CURLcode urlerr_cvt(CURLUcode ucode)

{
  CURLcode CVar1;
  
  if (ucode == CURLUE_BAD_HANDLE) {
    CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if (ucode == CURLUE_LACKS_IDN) {
    CVar1 = CURLE_NOT_BUILT_IN;
  }
  else if (ucode == CURLUE_OUT_OF_MEMORY) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else if (ucode == CURLUE_UNSUPPORTED_SCHEME) {
    CVar1 = CURLE_UNSUPPORTED_PROTOCOL;
  }
  else {
    CVar1 = CURLE_URL_MALFORMAT;
  }
  return CVar1;
}

Assistant:

CURLcode urlerr_cvt(CURLUcode ucode)
{
  if(ucode == CURLUE_OUT_OF_MEMORY)
    return CURLE_OUT_OF_MEMORY;
  else if(ucode == CURLUE_UNSUPPORTED_SCHEME)
    return CURLE_UNSUPPORTED_PROTOCOL;
  else if(ucode == CURLUE_LACKS_IDN)
    return CURLE_NOT_BUILT_IN;
  else if(ucode == CURLUE_BAD_HANDLE)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  return CURLE_URL_MALFORMAT;
}